

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_FinishConfigure
                  (PaAlsaStreamComponent *self,snd_pcm_hw_params_t *hwParams,
                  PaStreamParameters *params,int primeBuffers,double sampleRate,PaTime *latency)

{
  snd_pcm_t *psVar1;
  snd_pcm_uframes_t sVar2;
  long lVar3;
  snd_pcm_uframes_t sVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  PaError PVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  ulong local_60;
  snd_pcm_uframes_t bufSz;
  snd_pcm_uframes_t boundary;
  PaTime *local_48;
  double local_40;
  int local_38;
  PaError local_34;
  
  local_60 = 0;
  *latency = -1.0;
  uStack_70 = 0x10da06;
  local_48 = latency;
  local_40 = sampleRate;
  local_38 = primeBuffers;
  __n = snd_pcm_sw_params_sizeof();
  lVar3 = -(__n + 0xf & 0xfffffffffffffff0);
  local_34 = 0;
  boundary = (snd_pcm_uframes_t)(auStack_68 + lVar3);
  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10da2c;
  memset(auStack_68 + lVar3,0,__n);
  auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)self->framesPerPeriod);
  auVar10._8_4_ = (int)(self->framesPerPeriod >> 0x20);
  auVar10._12_4_ = 0x45300000;
  dVar9 = params->suggestedLatency * local_40 +
          (auVar10._8_8_ - 1.9342813113834067e+25) + (auVar10._0_8_ - 4503599627370496.0);
  local_60 = (ulong)dVar9;
  local_60 = (long)(dVar9 - 9.223372036854776e+18) & (long)local_60 >> 0x3f | local_60;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10da93;
  iVar5 = snd_pcm_hw_params_set_buffer_size_near(psVar1,hwParams,&local_60);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dcba;
    PaAlsaStreamComponent_FinishConfigure_cold_1();
    PVar8 = -9999;
  }
  else {
    psVar1 = self->pcm;
    *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10daaf;
    iVar5 = snd_pcm_hw_params(psVar1,hwParams);
    PVar8 = local_34;
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dcce;
      PaAlsaStreamComponent_FinishConfigure_cold_2();
      PVar8 = -9999;
    }
    sVar4 = boundary;
    if (-1 < iVar5) {
      if (alsa_snd_pcm_hw_params_get_buffer_size == (undefined1 *)0x0) {
        self->alsaBufferSize = local_60;
      }
      else {
        *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dae1;
        iVar5 = snd_pcm_hw_params_get_buffer_size(hwParams,&self->alsaBufferSize);
        if (iVar5 < 0) {
          *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dcf4;
          PaAlsaStreamComponent_FinishConfigure_cold_3();
          return -9999;
        }
      }
      lVar7 = self->alsaBufferSize - self->framesPerPeriod;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      *local_48 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / local_40;
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10db49;
      iVar5 = snd_pcm_sw_params_current(psVar1,sVar4);
      if (iVar5 < 0) {
        *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dce1;
        PaAlsaStreamComponent_FinishConfigure_cold_4();
        PVar8 = -9999;
      }
      else {
        psVar1 = self->pcm;
        sVar2 = self->framesPerPeriod;
        *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10db6d;
        iVar5 = snd_pcm_sw_params_set_start_threshold(psVar1,sVar4,sVar2);
        if (iVar5 < 0) {
          *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd07;
          PaAlsaStreamComponent_FinishConfigure_cold_5();
          PVar8 = -9999;
        }
        else {
          psVar1 = self->pcm;
          sVar2 = self->alsaBufferSize;
          *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10db91;
          iVar5 = snd_pcm_sw_params_set_stop_threshold(psVar1,sVar4,sVar2);
          if (iVar5 < 0) {
            *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd1a;
            PaAlsaStreamComponent_FinishConfigure_cold_6();
            PVar8 = -9999;
          }
          else {
            if (local_38 == 0) {
              *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc48;
              iVar5 = snd_pcm_sw_params_get_boundary(sVar4,&bufSz);
              if (iVar5 < 0) {
                *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd53;
                PaAlsaStreamComponent_FinishConfigure_cold_7();
                PVar8 = -9999;
                iVar5 = 6;
              }
              else {
                psVar1 = self->pcm;
                *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc6c;
                iVar5 = snd_pcm_sw_params_set_silence_threshold(psVar1,sVar4,0);
                if (iVar5 < 0) {
                  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd7f;
                  PaAlsaStreamComponent_FinishConfigure_cold_8();
                  PVar8 = -9999;
                  iVar5 = 6;
                }
                else {
                  psVar1 = self->pcm;
                  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc8c;
                  iVar6 = snd_pcm_sw_params_set_silence_size(psVar1,sVar4,bufSz);
                  iVar5 = 0;
                  if (iVar6 < 0) {
                    *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd97;
                    PaAlsaStreamComponent_FinishConfigure_cold_9();
                    PVar8 = -9999;
                    iVar5 = 6;
                  }
                }
              }
              if (iVar5 != 0) {
                return PVar8;
              }
            }
            psVar1 = self->pcm;
            sVar2 = self->framesPerPeriod;
            *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dbbf;
            iVar5 = snd_pcm_sw_params_set_avail_min(psVar1,sVar4,sVar2);
            if (iVar5 < 0) {
              *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd2d;
              PaAlsaStreamComponent_FinishConfigure_cold_10();
              PVar8 = -9999;
            }
            else {
              psVar1 = self->pcm;
              *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dbe4;
              iVar5 = snd_pcm_sw_params_set_xfer_align(psVar1,sVar4,1);
              if (iVar5 < 0) {
                *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd40;
                PaAlsaStreamComponent_FinishConfigure_cold_11();
                PVar8 = -9999;
              }
              else {
                psVar1 = self->pcm;
                *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc09;
                iVar5 = snd_pcm_sw_params_set_tstamp_mode(psVar1,sVar4,1);
                if (iVar5 < 0) {
                  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dd6c;
                  PaAlsaStreamComponent_FinishConfigure_cold_12();
                  PVar8 = -9999;
                }
                else {
                  psVar1 = self->pcm;
                  *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc29;
                  iVar5 = snd_pcm_sw_params(psVar1,sVar4);
                  if (iVar5 < 0) {
                    *(undefined8 *)(auStack_68 + lVar3 + -8) = 0x10dc34;
                    PaAlsaStreamComponent_FinishConfigure_cold_13();
                    PVar8 = -9999;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return PVar8;
}

Assistant:

static PaError PaAlsaStreamComponent_FinishConfigure( PaAlsaStreamComponent *self, snd_pcm_hw_params_t* hwParams,
        const PaStreamParameters *params, int primeBuffers, double sampleRate, PaTime* latency )
{
    PaError result = paNoError;
    snd_pcm_sw_params_t* swParams;
    snd_pcm_uframes_t bufSz = 0;
    *latency = -1.;

    alsa_snd_pcm_sw_params_alloca( &swParams );

    bufSz = params->suggestedLatency * sampleRate + self->framesPerPeriod;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz ), paUnanticipatedHostError );

    /* Set the parameters! */
    {
        int r = alsa_snd_pcm_hw_params( self->pcm, hwParams );
#ifdef PA_ENABLE_DEBUG_OUTPUT
        if( r < 0 )
        {
            snd_output_t *output = NULL;
            alsa_snd_output_stdio_attach( &output, stderr, 0 );
            alsa_snd_pcm_hw_params_dump( hwParams, output );
        }
#endif
        ENSURE_( r, paUnanticipatedHostError );
    }
    if( alsa_snd_pcm_hw_params_get_buffer_size != NULL )
    {
        ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize ), paUnanticipatedHostError );
    }
    else
    {
        self->alsaBufferSize = bufSz;
    }

    /* Latency in seconds */
    *latency = (self->alsaBufferSize - self->framesPerPeriod) / sampleRate;

    /* Now software parameters... */
    ENSURE_( alsa_snd_pcm_sw_params_current( self->pcm, swParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize ), paUnanticipatedHostError );

    /* Silence buffer in the case of underrun */
    if( !primeBuffers ) /* XXX: Make sense? */
    {
        snd_pcm_uframes_t boundary;
        ENSURE_( alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_ENABLE ), paUnanticipatedHostError );

    /* Set the parameters! */
    ENSURE_( alsa_snd_pcm_sw_params( self->pcm, swParams ), paUnanticipatedHostError );

error:
    return result;
}